

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.cpp
# Opt level: O2

void __thiscall OpenMD::Stats::parseStatFileFormat(Stats *this,string *format)

{
  bool bVar1;
  iterator iVar2;
  allocator<char> aaStack_b8 [8];
  StatsBitSet *local_b0;
  string token;
  StringTokenizer tokenizer;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&token," ,;|\t\n\r",aaStack_b8);
  StringTokenizer::StringTokenizer(&tokenizer,format,&token);
  std::__cxx11::string::~string((string *)&token);
  local_b0 = &this->statsMask_;
  while( true ) {
    bVar1 = StringTokenizer::hasMoreTokens(&tokenizer);
    if (!bVar1) break;
    StringTokenizer::nextToken_abi_cxx11_(&token,&tokenizer);
    std::locale::locale((locale *)aaStack_b8);
    toUpper<std::__cxx11::string>(&token,(locale *)aaStack_b8);
    std::locale::~locale((locale *)aaStack_b8);
    iVar2 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Stats::StatsIndex>_>_>
            ::find(&(this->statsMap_)._M_t,&token);
    if ((_Rb_tree_header *)iVar2._M_node == &(this->statsMap_)._M_t._M_impl.super__Rb_tree_header) {
      snprintf(painCave.errMsg,2000,
               "Stats::parseStatFileFormat: %s is not a recognized\n\tstatFileFormat keyword.\n",
               token._M_dataplus._M_p);
      painCave.isFatal = 0;
      painCave.severity = 1;
      simError();
    }
    else {
      std::bitset<46UL>::set(local_b0,(ulong)iVar2._M_node[2]._M_color,true);
    }
    std::__cxx11::string::~string((string *)&token);
  }
  StringTokenizer::~StringTokenizer(&tokenizer);
  return;
}

Assistant:

void Stats::parseStatFileFormat(const std::string& format) {
    StringTokenizer tokenizer(format, " ,;|\t\n\r");

    while (tokenizer.hasMoreTokens()) {
      std::string token(tokenizer.nextToken());
      toUpper(token);
      StatsMapType::iterator i = statsMap_.find(token);
      if (i != statsMap_.end()) {
        statsMask_.set(i->second);
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "Stats::parseStatFileFormat: %s is not a recognized\n"
                 "\tstatFileFormat keyword.\n",
                 token.c_str());
        painCave.isFatal  = 0;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
    }
  }